

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_pgroup_absolute_id(Integer grp,Integer pid)

{
  int iVar1;
  long in_RSI;
  ARMCI_Group *in_RDI;
  undefined8 local_8;
  
  local_8 = in_RSI;
  if (in_RDI != (ARMCI_Group *)(long)GA_World_Proc_Group) {
    iVar1 = ARMCI_Absolute_id(in_RDI,(int)((ulong)in_RSI >> 0x20));
    local_8 = (long)iVar1;
  }
  return local_8;
}

Assistant:

Integer pnga_pgroup_absolute_id(Integer grp, Integer pid) 
{
#ifdef MSG_COMMS_MPI
  if(grp == GA_World_Proc_Group) /*a.k.a -1*/
    return pid;
  else
    return ARMCI_Absolute_id(&PGRP_LIST[grp].group, pid);
#else
  pnga_error("ga_pgroup_absolute_id(): Defined only when using MPI groups",0);
  return -1;
#endif
}